

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_Privkey_Test::TestBody(Privkey_Privkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90 [3];
  ByteData local_78;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Privkey privkey;
  Privkey_Privkey_Test *this_local;
  
  cfd::core::Privkey::Privkey((Privkey *)&gtest_ar.message_);
  cfd::core::Privkey::GetData(&local_78,(Privkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,&local_78);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_40,"privkey.GetData().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData::~ByteData(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_privkey.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  cfd::core::Privkey::~Privkey((Privkey *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Privkey, Privkey) {
  Privkey privkey;
  EXPECT_STREQ(privkey.GetData().GetHex().c_str(), "");
}